

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O1

int utf8_check_string(char *string,size_t length)

{
  byte bVar1;
  bool bVar2;
  uchar u;
  size_t sVar3;
  ulong uVar4;
  ulong size;
  
  if (length != 0) {
    uVar4 = 0;
    do {
      bVar1 = string[uVar4];
      size = 1;
      if ((char)bVar1 < '\0') {
        if ((bVar1 & 0xfe) == 0xc0 || bVar1 < 0xc0) {
          size = 0;
        }
        else {
          size = 2;
          if ((0xdf < bVar1) && (size = 3, 0xef < bVar1)) {
            size = (ulong)(bVar1 < 0xf5) << 2;
          }
        }
      }
      if (size == 0) {
LAB_00109b45:
        bVar2 = false;
      }
      else if ((int)size == 1) {
LAB_00109b66:
        bVar2 = true;
      }
      else {
        if (length - uVar4 < size) goto LAB_00109b45;
        bVar2 = false;
        sVar3 = utf8_check_full(string + uVar4,size,(int32_t *)0x0);
        if (sVar3 != 0) {
          uVar4 = (uVar4 + size) - 1;
          goto LAB_00109b66;
        }
      }
      if (!bVar2) {
        return 0;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < length);
  }
  return 1;
}

Assistant:

int utf8_check_string(const char *string, size_t length)
{
    size_t i;

    for(i = 0; i < length; i++)
    {
        size_t count = utf8_check_first(string[i]);
        if(count == 0)
            return 0;
        else if(count > 1)
        {
            if(count > length - i)
                return 0;

            if(!utf8_check_full(&string[i], count, NULL))
                return 0;

            i += count - 1;
        }
    }

    return 1;
}